

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O1

void tommy_trie_insert(tommy_trie *trie,tommy_trie_node *node,void *data,tommy_key_t key)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  undefined8 *puVar6;
  tommy_node_struct *ptVar7;
  tommy_node_struct *ptVar8;
  byte bVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node->data = data;
  node->key = key;
  ptVar8 = (tommy_node_struct *)(trie->bucket + (key >> 0x1b));
  ptVar7 = ptVar8->next;
  if (ptVar7 != (tommy_node_struct *)0x0) {
    bVar9 = 0x1b;
    if (((ulong)ptVar7 & 1) != 0) {
      do {
        ptVar8 = ptVar7;
        uVar2 = (ulong)(key >> (bVar9 & 0x1f) & 7);
        ptVar7 = *(tommy_node_struct **)((long)ptVar8 + uVar2 * 8 + -1);
        if (ptVar7 == (tommy_node_struct *)0x0) {
          ptVar8 = (tommy_node_struct *)((long)ptVar8 + uVar2 * 8 + -1);
          goto LAB_00104b9b;
        }
        bVar9 = bVar9 - 3;
      } while (((ulong)ptVar7 & 1) != 0);
      ptVar8 = (tommy_node_struct *)((long)ptVar8 + uVar2 * 8 + -1);
    }
    if (ptVar7->key == key) {
      node->prev = ptVar7->prev;
      ptVar7->prev = node;
      node->next = (tommy_node_struct *)0x0;
      ptVar8 = node->prev;
      goto LAB_00104ba6;
    }
    puVar3 = (undefined8 *)tommy_allocator_alloc(trie->alloc);
    trie->node_count = trie->node_count + 1;
    ptVar8->next = (tommy_node_struct *)((long)puVar3 + 1);
    puVar3[6] = 0;
    puVar3[7] = 0;
    puVar3[4] = 0;
    puVar3[5] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    *puVar3 = 0;
    puVar3[1] = 0;
    uVar4 = ptVar7->key >> (bVar9 & 0x1f) & 7;
    uVar2 = (ulong)uVar4;
    uVar5 = key >> (bVar9 & 0x1f) & 7;
    puVar6 = puVar3;
    if (uVar4 == uVar5) {
      do {
        bVar9 = bVar9 - 3;
        puVar3 = (undefined8 *)tommy_allocator_alloc(trie->alloc);
        trie->node_count = trie->node_count + 1;
        puVar6[uVar2] = (long)puVar3 + 1;
        puVar3[6] = 0;
        puVar3[7] = 0;
        puVar3[4] = 0;
        puVar3[5] = 0;
        puVar3[2] = 0;
        puVar3[3] = 0;
        *puVar3 = 0;
        puVar3[1] = 0;
        uVar4 = ptVar7->key >> (bVar9 & 0x1f) & 7;
        uVar2 = (ulong)uVar4;
        uVar5 = key >> (bVar9 & 0x1f) & 7;
        puVar6 = puVar3;
      } while (uVar4 == uVar5);
    }
    puVar3[uVar2] = ptVar7;
    ptVar8 = (tommy_node_struct *)(puVar3 + uVar5);
  }
LAB_00104b9b:
  node->prev = node;
  node->next = (tommy_node_struct *)0x0;
LAB_00104ba6:
  ptVar8->next = node;
  trie->count = trie->count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_trie_insert(tommy_trie* trie, tommy_trie_node* node, void* data, tommy_key_t key)
{
	tommy_trie_node** let_ptr;

	node->data = data;
	node->key = key;

	let_ptr = &trie->bucket[key >> TOMMY_TRIE_BUCKET_SHIFT];

	trie_bucket_insert(trie, TOMMY_TRIE_BUCKET_SHIFT, let_ptr, node, key);

	++trie->count;
}